

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_expression.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformExpression(Transformer *this,PGNode *node)

{
  Transformer *this_00;
  PGResTarget *root;
  undefined8 uVar1;
  PGNode *in_RDX;
  Transformer *in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> in_RDI;
  PGCaseExpr *in_stack_00000010;
  Transformer *in_stack_00000018;
  PGTypeCast *in_stack_00000030;
  Transformer *in_stack_00000038;
  StackChecker<duckdb::Transformer> stack_checker;
  PGAIndirection *in_stack_00000250;
  Transformer *in_stack_00000258;
  PGIntervalConstant *in_stack_00000400;
  Transformer *in_stack_00000408;
  PGSubLink *in_stack_00000460;
  Transformer *in_stack_00000468;
  PGAStar *in_stack_00000760;
  Transformer *in_stack_00000768;
  PGFuncCall *in_stack_00000b40;
  Transformer *in_stack_00000b48;
  PGNodeTag in_stack_00000d14;
  Transformer *in_stack_00000d18;
  unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>_>
  *in_stack_fffffffffffffe88;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_fffffffffffffe90;
  PGAExpr *in_stack_fffffffffffffeb0;
  Transformer *in_stack_fffffffffffffeb8;
  PGAConst *in_stack_fffffffffffffed0;
  Transformer *in_stack_fffffffffffffed8;
  PGLambdaFunction *in_stack_fffffffffffffee0;
  Transformer *in_stack_fffffffffffffee8;
  PGAExpr *in_stack_fffffffffffffef0;
  Transformer *in_stack_fffffffffffffef8;
  int params_1;
  PGGroupingFunc *in_stack_ffffffffffffff00;
  Transformer *in_stack_ffffffffffffff08;
  NotImplementedException *in_stack_ffffffffffffff10;
  PGNodeTag PVar2;
  undefined4 in_stack_ffffffffffffff74;
  Transformer *in_stack_ffffffffffffff78;
  PGBoolExpr *in_stack_ffffffffffffff80;
  Transformer *in_stack_ffffffffffffff88;
  allocator local_61;
  string local_60 [40];
  undefined4 local_38;
  StackChecker<duckdb::Transformer> local_28;
  PGNode *local_18;
  
  local_18 = in_RDX;
  StackCheck(in_stack_fffffffffffffef8,(idx_t)in_stack_fffffffffffffef0);
  PVar2 = local_18->type;
  if (PVar2 == T_PGGroupingFunc) {
    PGCast<duckdb_libpgquery::PGGroupingFunc>(local_18);
    TransformGroupingFunction(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  }
  else if (PVar2 == T_PGNamedArgExpr) {
    PGCast<duckdb_libpgquery::PGNamedArgExpr>(local_18);
    TransformNamedArg(in_stack_ffffffffffffff08,(PGNamedArgExpr *)in_stack_ffffffffffffff00);
  }
  else if (PVar2 == T_PGBoolExpr) {
    PGCast<duckdb_libpgquery::PGBoolExpr>(local_18);
    TransformBoolExpr(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  else if (PVar2 == T_PGSubLink) {
    PGCast<duckdb_libpgquery::PGSubLink>(local_18);
    TransformSubquery(in_stack_00000468,in_stack_00000460);
  }
  else if (PVar2 == T_PGCaseExpr) {
    PGCast<duckdb_libpgquery::PGCaseExpr>(local_18);
    TransformCase(in_stack_00000018,in_stack_00000010);
  }
  else if (PVar2 == T_PGCoalesceExpr) {
    PGCast<duckdb_libpgquery::PGAExpr>(local_18);
    TransformCoalesce(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  }
  else if (PVar2 == T_PGSQLValueFunction) {
    PGCast<duckdb_libpgquery::PGSQLValueFunction>(local_18);
    TransformSQLValueFunction
              (in_stack_fffffffffffffed8,(PGSQLValueFunction *)in_stack_fffffffffffffed0);
  }
  else if (PVar2 == T_PGNullTest) {
    this_00 = (Transformer *)PGCast<duckdb_libpgquery::PGNullTest>(local_18);
    TransformNullTest(this_00,(PGNullTest *)in_stack_ffffffffffffff00);
  }
  else if (PVar2 == T_PGBooleanTest) {
    PGCast<duckdb_libpgquery::PGBooleanTest>(local_18);
    TransformBooleanTest(in_RSI,(PGBooleanTest *)in_RDI._M_head_impl);
  }
  else if (PVar2 == T_PGSetToDefault) {
    make_uniq<duckdb::DefaultExpression>();
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::DefaultExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>,_true>
                 *)0x1a1330d);
  }
  else if (PVar2 == T_PGLambdaFunction) {
    PGCast<duckdb_libpgquery::PGLambdaFunction>(local_18);
    TransformLambda(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  }
  else if (PVar2 == T_PGAExpr) {
    PGCast<duckdb_libpgquery::PGAExpr>(local_18);
    TransformAExpr(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  }
  else if (PVar2 == T_PGColumnRef) {
    PGCast<duckdb_libpgquery::PGColumnRef>(local_18);
    TransformColumnRef(in_stack_ffffffffffffff78,
                       (PGColumnRef *)CONCAT44(in_stack_ffffffffffffff74,PVar2));
  }
  else if (PVar2 == T_PGParamRef) {
    PGCast<duckdb_libpgquery::PGParamRef>(local_18);
    TransformParamRef(in_stack_ffffffffffffff78,
                      (PGParamRef *)CONCAT44(in_stack_ffffffffffffff74,PVar2));
  }
  else if (PVar2 == T_PGAConst) {
    PGCast<duckdb_libpgquery::PGAConst>(local_18);
    TransformConstant(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  else if (PVar2 == T_PGFuncCall) {
    PGCast<duckdb_libpgquery::PGFuncCall>(local_18);
    TransformFuncCall(in_stack_00000b48,in_stack_00000b40);
  }
  else if (PVar2 == T_PGAStar) {
    PGCast<duckdb_libpgquery::PGAStar>(local_18);
    TransformStarExpression(in_stack_00000768,in_stack_00000760);
  }
  else if (PVar2 == T_PGAIndirection) {
    PGCast<duckdb_libpgquery::PGAIndirection>(local_18);
    TransformArrayAccess(in_stack_00000258,in_stack_00000250);
  }
  else if (PVar2 == T_PGResTarget) {
    root = PGCast<duckdb_libpgquery::PGResTarget>(local_18);
    TransformResTarget(in_stack_ffffffffffffff08,root);
  }
  else if (PVar2 == T_PGMultiAssignRef) {
    PGCast<duckdb_libpgquery::PGMultiAssignRef>(local_18);
    TransformMultiAssignRef(in_stack_00000038,(PGMultiAssignRef *)in_stack_00000030);
  }
  else if (PVar2 == T_PGTypeCast) {
    PGCast<duckdb_libpgquery::PGTypeCast>(local_18);
    TransformTypeCast(in_stack_00000038,in_stack_00000030);
  }
  else if (PVar2 == T_PGCollateClause) {
    PGCast<duckdb_libpgquery::PGCollateClause>(local_18);
    TransformCollateExpr(in_stack_fffffffffffffef8,(PGCollateClause *)in_stack_fffffffffffffef0);
  }
  else if (PVar2 == T_PGIntervalConstant) {
    PGCast<duckdb_libpgquery::PGIntervalConstant>(local_18);
    TransformInterval(in_stack_00000408,in_stack_00000400);
  }
  else {
    if (PVar2 != T_PGPositionalReference) {
      uVar1 = __cxa_allocate_exception(0x10);
      params_1 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"Expression type %s (%d)",&local_61);
      NodetypeToString_abi_cxx11_(in_stack_00000d18,in_stack_00000d14);
      NotImplementedException::NotImplementedException<std::__cxx11::string,int>
                (in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff00,params_1);
      __cxa_throw(uVar1,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    PGCast<duckdb_libpgquery::PGPositionalReference>(local_18);
    TransformPositionalReference
              (in_stack_ffffffffffffff08,(PGPositionalReference *)in_stack_ffffffffffffff00);
  }
  local_38 = 1;
  StackChecker<duckdb::Transformer>::~StackChecker(&local_28);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )in_RDI._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformExpression(duckdb_libpgquery::PGNode &node) {

	auto stack_checker = StackCheck();

	switch (node.type) {
	case duckdb_libpgquery::T_PGColumnRef:
		return TransformColumnRef(PGCast<duckdb_libpgquery::PGColumnRef>(node));
	case duckdb_libpgquery::T_PGAConst:
		return TransformConstant(PGCast<duckdb_libpgquery::PGAConst>(node));
	case duckdb_libpgquery::T_PGAExpr:
		return TransformAExpr(PGCast<duckdb_libpgquery::PGAExpr>(node));
	case duckdb_libpgquery::T_PGFuncCall:
		return TransformFuncCall(PGCast<duckdb_libpgquery::PGFuncCall>(node));
	case duckdb_libpgquery::T_PGBoolExpr:
		return TransformBoolExpr(PGCast<duckdb_libpgquery::PGBoolExpr>(node));
	case duckdb_libpgquery::T_PGTypeCast:
		return TransformTypeCast(PGCast<duckdb_libpgquery::PGTypeCast>(node));
	case duckdb_libpgquery::T_PGCaseExpr:
		return TransformCase(PGCast<duckdb_libpgquery::PGCaseExpr>(node));
	case duckdb_libpgquery::T_PGSubLink:
		return TransformSubquery(PGCast<duckdb_libpgquery::PGSubLink>(node));
	case duckdb_libpgquery::T_PGCoalesceExpr:
		return TransformCoalesce(PGCast<duckdb_libpgquery::PGAExpr>(node));
	case duckdb_libpgquery::T_PGNullTest:
		return TransformNullTest(PGCast<duckdb_libpgquery::PGNullTest>(node));
	case duckdb_libpgquery::T_PGResTarget:
		return TransformResTarget(PGCast<duckdb_libpgquery::PGResTarget>(node));
	case duckdb_libpgquery::T_PGParamRef:
		return TransformParamRef(PGCast<duckdb_libpgquery::PGParamRef>(node));
	case duckdb_libpgquery::T_PGNamedArgExpr:
		return TransformNamedArg(PGCast<duckdb_libpgquery::PGNamedArgExpr>(node));
	case duckdb_libpgquery::T_PGSQLValueFunction:
		return TransformSQLValueFunction(PGCast<duckdb_libpgquery::PGSQLValueFunction>(node));
	case duckdb_libpgquery::T_PGSetToDefault:
		return make_uniq<DefaultExpression>();
	case duckdb_libpgquery::T_PGCollateClause:
		return TransformCollateExpr(PGCast<duckdb_libpgquery::PGCollateClause>(node));
	case duckdb_libpgquery::T_PGIntervalConstant:
		return TransformInterval(PGCast<duckdb_libpgquery::PGIntervalConstant>(node));
	case duckdb_libpgquery::T_PGLambdaFunction:
		return TransformLambda(PGCast<duckdb_libpgquery::PGLambdaFunction>(node));
	case duckdb_libpgquery::T_PGAIndirection:
		return TransformArrayAccess(PGCast<duckdb_libpgquery::PGAIndirection>(node));
	case duckdb_libpgquery::T_PGPositionalReference:
		return TransformPositionalReference(PGCast<duckdb_libpgquery::PGPositionalReference>(node));
	case duckdb_libpgquery::T_PGGroupingFunc:
		return TransformGroupingFunction(PGCast<duckdb_libpgquery::PGGroupingFunc>(node));
	case duckdb_libpgquery::T_PGAStar:
		return TransformStarExpression(PGCast<duckdb_libpgquery::PGAStar>(node));
	case duckdb_libpgquery::T_PGBooleanTest:
		return TransformBooleanTest(PGCast<duckdb_libpgquery::PGBooleanTest>(node));
	case duckdb_libpgquery::T_PGMultiAssignRef:
		return TransformMultiAssignRef(PGCast<duckdb_libpgquery::PGMultiAssignRef>(node));

	default:
		throw NotImplementedException("Expression type %s (%d)", NodetypeToString(node.type), (int)node.type);
	}
}